

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

bool __thiscall rapic::client::dequeue(client *this,message_type *type)

{
  bool bVar1;
  memory_order mVar2;
  __int_type _Var3;
  __int_type _Var4;
  byte *pbVar5;
  undefined8 *puVar6;
  long lVar7;
  runtime_error *this_00;
  client *in_RSI;
  long in_RDI;
  __int_type wc;
  memory_order __b;
  size_t in_stack_ffffffffffffff78;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff80;
  string *str;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  string *str_00;
  int iVar8;
  int iVar9;
  
  if (*(int *)(in_RDI + 0xc0) != -1) {
    std::__atomic_base<unsigned_long>::operator+=
              ((__atomic_base<unsigned_long> *)(in_RDI + 0xb8),*(__int_type *)(in_RDI + 200));
  }
  *(undefined4 *)(in_RDI + 0xc0) = 0xffffffff;
  *(undefined8 *)(in_RDI + 200) = 0;
  while( true ) {
    _Var3 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    _Var4 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (_Var3 == _Var4) {
      return false;
    }
    std::__atomic_base::operator_cast_to_unsigned_long
              ((__atomic_base<unsigned_long> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    pbVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (0x20 < *pbVar5) break;
    std::__atomic_base<unsigned_long>::operator++((__atomic_base<unsigned_long> *)(in_RDI + 0xb8));
  }
  puVar6 = (undefined8 *)(in_RDI + 0xb0);
  iVar8 = 5;
  mVar2 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (iVar8 - 1U < 2) {
    str = (string *)*puVar6;
  }
  else if (iVar8 == 5) {
    str = (string *)*puVar6;
  }
  else {
    str = (string *)*puVar6;
  }
  str_00 = str;
  iVar9 = iVar8;
  bVar1 = buffer_starts_with(in_RSI,str);
  if (bVar1) {
    bVar1 = buffer_starts_with(in_RSI,str);
    if (bVar1) {
      bVar1 = buffer_find((client *)CONCAT44(iVar9,mVar2),str_00,
                          (size_t *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      if (bVar1) {
        *(undefined4 *)in_RSI = 0;
        *(undefined4 *)(in_RDI + 0xc0) = 0;
        lVar7 = std::__cxx11::string::size();
        *(long *)(in_RDI + 200) = lVar7 + *(long *)(in_RDI + 200);
        return true;
      }
    }
    else {
      bVar1 = buffer_find((client *)CONCAT44(iVar9,mVar2),str_00,
                          (size_t *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      if (bVar1) {
        *(undefined4 *)in_RSI = 0;
        *(undefined4 *)(in_RDI + 0xc0) = 0;
        lVar7 = std::__cxx11::string::size();
        *(long *)(in_RDI + 200) = lVar7 + *(long *)(in_RDI + 200);
        return true;
      }
    }
  }
  else {
    bVar1 = buffer_find((client *)CONCAT44(iVar9,mVar2),str_00,
                        (size_t *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    if (bVar1) {
      *(undefined4 *)in_RSI = 1;
      *(undefined4 *)(in_RDI + 0xc0) = 1;
      lVar7 = std::__cxx11::string::size();
      *(long *)(in_RDI + 200) = lVar7 + *(long *)(in_RDI + 200);
      return true;
    }
  }
  _Var3 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)CONCAT44(iVar8,in_stack_ffffffffffffff88));
  if ((long)str - _Var3 != *(long *)(in_RDI + 0xa8)) {
    return false;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"rapic: buffer overflow (try increasing buffer size)");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto client::dequeue(message_type& type) -> bool
{
  // move along to the next packet in the buffer if needed
  if (cur_type_ != no_message)
    rcount_ += cur_size_;

  // reset our current type
  cur_type_ = no_message;
  cur_size_ = 0;

  // ignore leading whitespace (and return if no data at all)
  while (true)
  {
    if (wcount_ == rcount_)
      return false;
    if (buffer_[rcount_ % capacity_] > 0x20)
      break;
    ++rcount_;
  }

  // cache write count to ensure consistent overflow check at the end of this function
  auto wc = wcount_.load();

  // is it an MSSG style message?
  if (buffer_starts_with(msg_mssg_head))
  {
    // status 30 is multi-line terminated by "END STATUS"
    if (buffer_starts_with(msg_mssg30_head))
    {
      if (buffer_find(msg_mssg30_term, cur_size_))
      {
        cur_type_ = type = message_type::mssg;
        cur_size_ += msg_mssg30_term.size();
        return true;
      }
    }
    // otherwise assume it is a single line message and look for an end of line
    else
    {
      if (buffer_find(msg_mssg_term, cur_size_))
      {
        cur_type_ = type = message_type::mssg;
        cur_size_ += msg_mssg_term.size();
        return true;
      }
    }
  }
  // otherwise assume it is a scan message and look for "END RADAR IMAGE"
  else
  {
    if (buffer_find(msg_scan_term, cur_size_))
    {
      cur_type_ = type = message_type::scan;
      cur_size_ += msg_scan_term.size();
      return true;
    }
  }

  // if the buffer is full but we still cannot read a message then we are in overflow, fail hard
  if (wc - rcount_ == capacity_)
    throw std::runtime_error{"rapic: buffer overflow (try increasing buffer size)"};

  return false;
}